

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_List.h
# Opt level: O0

void __thiscall
axl::sl::
OwningListBase<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::ListLink>,_axl::sl::Iterator<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::ListLink>_>,_axl::mem::Delete<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>_>_>
::clear(OwningListBase<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::ListLink>,_axl::sl::Iterator<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::ListLink>_>,_axl::mem::Delete<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>_>_>
        *this)

{
  Delete<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>_>
  *in_RDI;
  HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()> *p;
  ListLink *link;
  HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>
  *in_stack_ffffffffffffffc8;
  Entry *in_stack_ffffffffffffffe0;
  ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::ListLink>
  local_11;
  ListLink *local_10;
  
  if (*(long *)in_RDI != 0) {
    local_10 = ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::ListLink>
               ::operator()(&local_11,
                            *(HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>
                              **)in_RDI);
    while (local_10 != (ListLink *)0x0) {
      in_stack_ffffffffffffffe0 =
           IteratorBase<axl::sl::Iterator<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::ListLink>_>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::ListLink>_>
           ::getEntryFromLink((Link *)in_stack_ffffffffffffffe0);
      local_10 = ListLink::getNext(local_10);
      mem::
      Delete<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>_>
      ::operator()(in_RDI,in_stack_ffffffffffffffc8);
    }
    ListBase<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::ListLink>,_axl::sl::Iterator<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::ListLink>_>_>
    ::construct((ListBase<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::ListLink>,_axl::sl::Iterator<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::ListLink>_>_>
                 *)in_RDI);
  }
  return;
}

Assistant:

void
	clear() {
		if (!this->m_head)
			return;

		ListLink* link = GetLink()(this->m_head);
		while (link) {
			T* p = Iterator::getEntryFromLink(link);
			link = link->getNext();
			Delete()(p);
		}

		this->construct();
	}